

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O1

void anon_unknown.dwarf_16838d::readWholeFiles(int modification)

{
  float fVar1;
  _Rb_tree_color _Var2;
  size_t sVar3;
  char *pcVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  int iVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  float *pfVar14;
  float *pfVar15;
  int *piVar16;
  ChannelList *this;
  ChannelList *pCVar17;
  uint *puVar18;
  ostream *poVar19;
  uint uVar20;
  undefined8 uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  int iVar32;
  DeepScanLineInputPart part_1;
  vector<int,_std::allocator<int>_> shuffledPartNumber;
  Array2D<unsigned_int> sampleCount;
  Array2D<Imath_3_2::half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  MultiPartInputFile file;
  FrameBuffer frameBuffer;
  Array2D<Imath_3_2::half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  InputPart part;
  int local_1fc;
  undefined1 local_1f0 [8];
  _Base_ptr local_1e8;
  iterator iStack_1e0;
  _Base_ptr local_1d8;
  Array2D<unsigned_int> local_1c8;
  uint *local_1a8;
  int local_1a0;
  int local_19c;
  Array2D<Imath_3_2::half_*> local_198;
  Array2D<float_*> local_178;
  Array2D<unsigned_int_*> local_158;
  MultiPartInputFile local_140 [16];
  DeepFrameBuffer local_130;
  Array2D<Imath_3_2::half> local_c8;
  Array2D<float> local_a8;
  Array2D<unsigned_int> local_88;
  ulong local_70;
  FrameBuffer local_68;
  
  pcVar4 = (anonymous_namespace)::filename_abi_cxx11_;
  local_88._sizeX = 0;
  local_88._sizeY = 0;
  local_88._data = (uint *)0x0;
  local_a8._data = (float *)0x0;
  local_a8._sizeX = 0;
  local_a8._sizeY = 0;
  local_c8._data = (half *)0x0;
  local_c8._sizeX = 0;
  local_c8._sizeY = 0;
  local_158._data = (uint **)0x0;
  local_158._sizeX = 0;
  local_158._sizeY = 0;
  local_178._data = (float **)0x0;
  local_178._sizeX = 0;
  local_178._sizeY = 0;
  local_198._data = (half **)0x0;
  local_198._sizeX = 0;
  local_198._sizeY = 0;
  local_1c8._data = (uint *)0x0;
  local_1c8._sizeX = 0;
  local_1c8._sizeY = 0;
  iVar7 = Imf_3_2::globalThreadCount();
  uVar21 = 1;
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_140,pcVar4,iVar7,true);
  lVar26 = 0;
  while( true ) {
    uVar10 = (undefined4)uVar21;
    iVar7 = Imf_3_2::MultiPartInputFile::parts();
    if (iVar7 <= lVar26) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Reading whole files ",0x14);
      std::ostream::flush();
      local_1e8 = (_Base_ptr)0x0;
      iStack_1e0._M_current = (int *)0x0;
      local_1d8 = (_Base_ptr)0x0;
      local_130._map._M_t._M_impl._0_4_ = ZEXT14(0 < modification);
      if ((int)local_130._map._M_t._M_impl._0_4_ <
          (int)((ulong)(DAT_001ef788 - (anonymous_namespace)::headers) >> 3) * -0x49249249) {
        do {
          if ((_Base_ptr)iStack_1e0._M_current == local_1d8) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_1e8,iStack_1e0,(int *)&local_130);
          }
          else {
            *iStack_1e0._M_current = local_130._map._M_t._M_impl._0_4_;
            iStack_1e0._M_current = iStack_1e0._M_current + 1;
          }
          local_130._map._M_t._M_impl._0_4_ = local_130._map._M_t._M_impl._0_4_ + 1;
        } while ((int)local_130._map._M_t._M_impl._0_4_ <
                 (int)((ulong)(DAT_001ef788 - (anonymous_namespace)::headers) >> 3) * -0x49249249);
      }
      if ((long)iStack_1e0._M_current - (long)local_1e8 != 0) {
        uVar23 = (long)iStack_1e0._M_current - (long)local_1e8 >> 2;
        uVar24 = 0;
        do {
          iVar7 = random_int((int)uVar23);
          iVar31 = random_int((int)((ulong)((long)iStack_1e0._M_current - (long)local_1e8) >> 2));
          _Var2 = (&local_1e8->_M_color)[iVar7];
          (&local_1e8->_M_color)[iVar7] = (&local_1e8->_M_color)[iVar31];
          (&local_1e8->_M_color)[iVar31] = _Var2;
          uVar24 = uVar24 + 1;
          uVar23 = (long)iStack_1e0._M_current - (long)local_1e8 >> 2;
        } while (uVar24 < uVar23);
      }
      if ((_Base_ptr)iStack_1e0._M_current != local_1e8) {
        uVar23 = 0;
        do {
          _Var2 = (&local_1e8->_M_color)[uVar23];
          lVar26 = (long)(int)_Var2;
          local_70 = uVar23;
          switch(*(undefined4 *)((anonymous_namespace)::partTypes + lVar26 * 4)) {
          case 0:
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_130._map._M_t._M_impl.super__Rb_tree_header._M_header;
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            setInputFrameBuffer((FrameBuffer *)&local_130,
                                *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),&local_88,
                                &local_a8,&local_c8,0x10,0x10);
            Imf_3_2::InputPart::InputPart((InputPart *)&local_68,local_140,_Var2);
            Imf_3_2::InputPart::setFrameBuffer(&local_68);
            Imf_3_2::InputPart::readPixels((int)&local_68,0);
            iVar7 = *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4);
            if (iVar7 == 0) {
              bVar6 = checkPixels<unsigned_int>(&local_88,0,0xf,0,0xf,0x10);
              if (!bVar6) {
                __assert_fail("checkPixels<unsigned int> ( uData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                              ,0x36d,"void (anonymous namespace)::readWholeFiles(int)");
              }
            }
            else if (iVar7 == 1) {
              bVar6 = checkPixels<float>(&local_a8,0,0xf,0,0xf,0x10);
              if (!bVar6) {
                __assert_fail("checkPixels<float> (fData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                              ,0x370,"void (anonymous namespace)::readWholeFiles(int)");
              }
            }
            else if ((iVar7 == 2) &&
                    (bVar6 = checkPixels<Imath_3_2::half>(&local_c8,0,0xf,0,0xf,0x10), !bVar6)) {
              __assert_fail("checkPixels<half> (hData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                            ,0x373,"void (anonymous namespace)::readWholeFiles(int)");
            }
            std::
            _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
            ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                         *)&local_130);
            break;
          case 1:
            Imf_3_2::TiledInputPart::TiledInputPart((TiledInputPart *)&local_68,local_140,_Var2);
            uVar10 = Imf_3_2::TiledInputPart::numXLevels();
            local_1a8 = (uint *)CONCAT44(local_1a8._4_4_,uVar10);
            iVar7 = Imf_3_2::TiledInputPart::numYLevels();
            if (0 < (int)local_1a8) {
              iVar31 = 0;
              do {
                if (0 < iVar7) {
                  iVar32 = 0;
                  do {
                    cVar5 = Imf_3_2::TiledInputPart::isValidLevel((int)&local_68,iVar31);
                    if (cVar5 != '\0') {
                      iVar9 = Imf_3_2::TiledInputPart::levelWidth((int)&local_68);
                      iVar22 = Imf_3_2::TiledInputPart::levelHeight((int)&local_68);
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                           (_Base_ptr)0x0;
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                           &local_130._map._M_t._M_impl.super__Rb_tree_header._M_header;
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                           local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                      setInputFrameBuffer((FrameBuffer *)&local_130,
                                          *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),
                                          &local_88,&local_a8,&local_c8,iVar9,iVar22);
                      Imf_3_2::TiledInputPart::setFrameBuffer(&local_68);
                      iVar11 = (int)&local_68;
                      iVar8 = Imf_3_2::TiledInputPart::numXTiles(iVar11);
                      iVar11 = Imf_3_2::TiledInputPart::numYTiles(iVar11);
                      Imf_3_2::TiledInputPart::readTiles
                                ((int)&local_68,0,iVar8 + -1,0,iVar11 + -1,iVar31);
                      iVar8 = *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4);
                      if (iVar8 == 0) {
                        bVar6 = checkPixels<unsigned_int>
                                          (&local_88,0,iVar9 + -1,0,iVar22 + -1,iVar9);
                        if (!bVar6) {
                          __assert_fail("checkPixels<unsigned int> ( uData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                        ,0x39c,"void (anonymous namespace)::readWholeFiles(int)");
                        }
                      }
                      else if (iVar8 == 1) {
                        bVar6 = checkPixels<float>(&local_a8,0,iVar9 + -1,0,iVar22 + -1,iVar9);
                        if (!bVar6) {
                          __assert_fail("checkPixels<float> (fData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                        ,0x39f,"void (anonymous namespace)::readWholeFiles(int)");
                        }
                      }
                      else if ((iVar8 == 2) &&
                              (bVar6 = checkPixels<Imath_3_2::half>
                                                 (&local_c8,0,iVar9 + -1,0,iVar22 + -1,iVar9),
                              !bVar6)) {
                        __assert_fail("checkPixels<half> (hData, w, h)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                      ,0x3a2,"void (anonymous namespace)::readWholeFiles(int)");
                      }
                      std::
                      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                                   *)&local_130);
                    }
                    iVar32 = iVar32 + 1;
                  } while (iVar7 != iVar32);
                }
                iVar31 = iVar31 + 1;
              } while (iVar31 != (int)local_1a8);
            }
            break;
          case 2:
            Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
                      ((DeepScanLineInputPart *)local_1f0,local_140,_Var2);
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_130._map._M_t._M_impl.super__Rb_tree_header._M_header;
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            Imf_3_2::Slice::Slice(&local_130._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false)
            ;
            puVar18 = (uint *)operator_new__(0x400);
            if (local_1c8._data != (uint *)0x0) {
              operator_delete__(local_1c8._data);
            }
            local_1c8._sizeX = 0x10;
            local_1c8._sizeY = 0x10;
            local_1c8._data = puVar18;
            Imf_3_2::Slice::Slice
                      ((Slice *)&local_68,UINT,(char *)puVar18,4,0x40,1,1,0.0,false,false);
            Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&local_130);
            setInputDeepFrameBuffer
                      (&local_130,*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),
                       &local_158,&local_178,&local_198,0x10,0x10);
            Imf_3_2::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)local_1f0);
            Imf_3_2::DeepScanLineInputPart::readPixelSampleCounts((int)local_1f0,0);
            allocatePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),&local_1c8,
                           &local_158,&local_178,&local_198,0,0xf,0,0xf);
            Imf_3_2::DeepScanLineInputPart::readPixels((int)local_1f0,0);
            iVar7 = *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4);
            if (iVar7 == 0) {
              bVar6 = checkPixels<unsigned_int>(&local_1c8,&local_158,0,0xf,0,0xf,0x10);
              if (!bVar6) {
                __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                              ,0x3cf,"void (anonymous namespace)::readWholeFiles(int)");
              }
            }
            else if (iVar7 == 1) {
              bVar6 = checkPixels<float>(&local_1c8,&local_178,0,0xf,0,0xf,0x10);
              if (!bVar6) {
                __assert_fail("checkPixels<float> ( sampleCount, deepFData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                              ,0x3d3,"void (anonymous namespace)::readWholeFiles(int)");
              }
            }
            else if ((iVar7 == 2) &&
                    (bVar6 = checkPixels<Imath_3_2::half>(&local_1c8,&local_198,0,0xf,0,0xf,0x10),
                    !bVar6)) {
              __assert_fail("checkPixels<half> ( sampleCount, deepHData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                            ,0x3d7,"void (anonymous namespace)::readWholeFiles(int)");
            }
            releasePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),&local_158,
                          &local_178,&local_198,0,0xf,0,0xf);
            std::
            _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
            ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                         *)&local_130);
            break;
          case 3:
            Imf_3_2::DeepTiledInputPart::DeepTiledInputPart
                      ((DeepTiledInputPart *)local_1f0,local_140,_Var2);
            local_1a0 = Imf_3_2::DeepTiledInputPart::numXLevels();
            local_19c = Imf_3_2::DeepTiledInputPart::numYLevels();
            if (0 < local_1a0) {
              local_1fc = 0;
              do {
                if (0 < local_19c) {
                  iVar7 = 0;
                  puVar18 = local_1c8._data;
                  do {
                    cVar5 = Imf_3_2::DeepTiledInputPart::isValidLevel((int)local_1f0,local_1fc);
                    if (cVar5 != '\0') {
                      iVar31 = Imf_3_2::DeepTiledInputPart::levelWidth((int)local_1f0);
                      iVar32 = Imf_3_2::DeepTiledInputPart::levelHeight((int)local_1f0);
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                           (_Base_ptr)0x0;
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                           &local_130._map._M_t._M_impl.super__Rb_tree_header._M_header;
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                           local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                      Imf_3_2::Slice::Slice
                                (&local_130._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
                      lVar25 = (long)iVar31;
                      uVar23 = iVar32 * lVar25;
                      local_1a8 = (uint *)operator_new__(-(ulong)(uVar23 >> 0x3e != 0) | uVar23 * 4)
                      ;
                      if (puVar18 != (uint *)0x0) {
                        operator_delete__(puVar18);
                      }
                      local_1c8._data = local_1a8;
                      local_1c8._sizeX = (long)iVar32;
                      local_1c8._sizeY = lVar25;
                      Imf_3_2::Slice::Slice
                                ((Slice *)&local_68,UINT,(char *)local_1a8,4,lVar25 << 2,1,1,0.0,
                                 false,false);
                      Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&local_130);
                      setInputDeepFrameBuffer
                                (&local_130,*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4)
                                 ,&local_158,&local_178,&local_198,iVar31,iVar32);
                      Imf_3_2::DeepTiledInputPart::setFrameBuffer((DeepFrameBuffer *)local_1f0);
                      iVar8 = Imf_3_2::DeepTiledInputPart::numXTiles((int)local_1f0);
                      iVar9 = Imf_3_2::DeepTiledInputPart::numYTiles((int)local_1f0);
                      Imf_3_2::DeepTiledInputPart::readPixelSampleCounts
                                ((int)local_1f0,0,iVar8 + -1,0,iVar9 + -1,local_1fc);
                      iVar22 = iVar31 + -1;
                      iVar32 = iVar32 + -1;
                      allocatePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),
                                     &local_1c8,&local_158,&local_178,&local_198,0,iVar22,0,iVar32);
                      Imf_3_2::DeepTiledInputPart::readTiles
                                ((int)local_1f0,0,iVar8 + -1,0,iVar9 + -1,local_1fc);
                      iVar8 = *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4);
                      if (iVar8 == 0) {
                        bVar6 = checkPixels<unsigned_int>
                                          (&local_1c8,&local_158,0,iVar22,0,iVar32,iVar31);
                        if (!bVar6) {
                          __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                        ,0x424,"void (anonymous namespace)::readWholeFiles(int)");
                        }
                      }
                      else if (iVar8 == 1) {
                        bVar6 = checkPixels<float>(&local_1c8,&local_178,0,iVar22,0,iVar32,iVar31);
                        if (!bVar6) {
                          __assert_fail("checkPixels<float> ( sampleCount, deepFData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                        ,0x428,"void (anonymous namespace)::readWholeFiles(int)");
                        }
                      }
                      else if ((iVar8 == 2) &&
                              (bVar6 = checkPixels<Imath_3_2::half>
                                                 (&local_1c8,&local_198,0,iVar22,0,iVar32,iVar31),
                              !bVar6)) {
                        __assert_fail("checkPixels<half> ( sampleCount, deepHData, w, h)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                      ,0x42c,"void (anonymous namespace)::readWholeFiles(int)");
                      }
                      releasePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),
                                    &local_158,&local_178,&local_198,0,iVar22,0,iVar32);
                      std::
                      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                                   *)&local_130);
                      puVar18 = local_1a8;
                    }
                    iVar7 = iVar7 + 1;
                  } while (local_19c != iVar7);
                }
                local_1fc = local_1fc + 1;
              } while (local_1fc != local_1a0);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"part ",5);
          poVar19 = (ostream *)std::ostream::operator<<(&std::cerr,_Var2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19," ok ",4);
          uVar23 = local_70 + 1;
        } while (uVar23 < (ulong)((long)iStack_1e0._M_current - (long)local_1e8 >> 2));
      }
      if (local_1e8 != (_Base_ptr)0x0) {
        operator_delete(local_1e8,(long)local_1d8 - (long)local_1e8);
      }
      Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_140);
      if (local_1c8._data != (uint *)0x0) {
        operator_delete__(local_1c8._data);
      }
      if (local_198._data != (half **)0x0) {
        operator_delete__(local_198._data);
      }
      if (local_178._data != (float **)0x0) {
        operator_delete__(local_178._data);
      }
      if (local_158._data != (uint **)0x0) {
        operator_delete__(local_158._data);
      }
      if (local_c8._data != (half *)0x0) {
        operator_delete__(local_c8._data);
      }
      if (local_a8._data != (float *)0x0) {
        operator_delete__(local_a8._data);
      }
      if (local_88._data != (uint *)0x0) {
        operator_delete__(local_88._data);
      }
      return;
    }
    Imf_3_2::MultiPartInputFile::header((int)local_140);
    puVar12 = (undefined8 *)Imf_3_2::Header::displayWindow();
    puVar13 = (undefined8 *)Imf_3_2::Header::displayWindow();
    iVar7 = -(uint)((int)*puVar13 == (int)*puVar12);
    iVar31 = -(uint)((int)((ulong)*puVar13 >> 0x20) == (int)((ulong)*puVar12 >> 0x20));
    auVar27._4_4_ = iVar7;
    auVar27._0_4_ = iVar7;
    auVar27._8_4_ = iVar31;
    auVar27._12_4_ = iVar31;
    iVar7 = movmskpd(uVar10,auVar27);
    if ((iVar7 != 3) ||
       (iVar31 = -(uint)((int)puVar13[1] == (int)puVar12[1]),
       iVar32 = -(uint)((int)((ulong)puVar13[1] >> 0x20) == (int)((ulong)puVar12[1] >> 0x20)),
       auVar28._4_4_ = iVar31, auVar28._0_4_ = iVar31, auVar28._8_4_ = iVar32,
       auVar28._12_4_ = iVar32, iVar31 = movmskpd((int)puVar13,auVar28), iVar31 != 3)) {
      __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x32b,"void (anonymous namespace)::readWholeFiles(int)");
    }
    puVar12 = (undefined8 *)Imf_3_2::Header::dataWindow();
    puVar13 = (undefined8 *)Imf_3_2::Header::dataWindow();
    iVar31 = -(uint)((int)*puVar13 == (int)*puVar12);
    iVar32 = -(uint)((int)((ulong)*puVar13 >> 0x20) == (int)((ulong)*puVar12 >> 0x20));
    auVar29._4_4_ = iVar31;
    auVar29._0_4_ = iVar31;
    auVar29._8_4_ = iVar32;
    auVar29._12_4_ = iVar32;
    uVar20 = movmskpd(iVar7,auVar29);
    uVar23 = (ulong)uVar20;
    if ((uVar20 != 3) ||
       (iVar7 = -(uint)((int)puVar13[1] == (int)puVar12[1]),
       iVar31 = -(uint)((int)((ulong)puVar13[1] >> 0x20) == (int)((ulong)puVar12[1] >> 0x20)),
       auVar30._4_4_ = iVar7, auVar30._0_4_ = iVar7, auVar30._8_4_ = iVar31, auVar30._12_4_ = iVar31
       , iVar7 = movmskpd((int)puVar13,auVar30), iVar7 != 3)) {
      __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x32c,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pfVar14 = (float *)Imf_3_2::Header::pixelAspectRatio();
    fVar1 = *pfVar14;
    pfVar14 = (float *)Imf_3_2::Header::pixelAspectRatio();
    if ((fVar1 != *pfVar14) || (NAN(fVar1) || NAN(*pfVar14))) break;
    pfVar14 = (float *)Imf_3_2::Header::screenWindowCenter();
    pfVar15 = (float *)Imf_3_2::Header::screenWindowCenter();
    if ((((*pfVar14 != *pfVar15) || (NAN(*pfVar14) || NAN(*pfVar15))) || (pfVar14[1] != pfVar15[1]))
       || (NAN(pfVar14[1]) || NAN(pfVar15[1]))) {
      __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x32f,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pfVar14 = (float *)Imf_3_2::Header::screenWindowWidth();
    fVar1 = *pfVar14;
    pfVar14 = (float *)Imf_3_2::Header::screenWindowWidth();
    if ((fVar1 != *pfVar14) || (NAN(fVar1) || NAN(*pfVar14))) {
      __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x330,"void (anonymous namespace)::readWholeFiles(int)");
    }
    piVar16 = (int *)Imf_3_2::Header::lineOrder();
    iVar7 = *piVar16;
    piVar16 = (int *)Imf_3_2::Header::lineOrder();
    if (iVar7 != *piVar16) {
      __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x331,"void (anonymous namespace)::readWholeFiles(int)");
    }
    piVar16 = (int *)Imf_3_2::Header::compression();
    iVar7 = *piVar16;
    piVar16 = (int *)Imf_3_2::Header::compression();
    if (iVar7 != *piVar16) {
      __assert_fail("header.compression () == headers[i].compression ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x332,"void (anonymous namespace)::readWholeFiles(int)");
    }
    this = (ChannelList *)Imf_3_2::Header::channels();
    pCVar17 = (ChannelList *)Imf_3_2::Header::channels();
    cVar5 = Imf_3_2::ChannelList::operator==(this,pCVar17);
    if (cVar5 == '\0') {
      __assert_fail("header.channels () == headers[i].channels ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x333,"void (anonymous namespace)::readWholeFiles(int)");
    }
    puVar12 = (undefined8 *)Imf_3_2::Header::name_abi_cxx11_();
    puVar13 = (undefined8 *)Imf_3_2::Header::name_abi_cxx11_();
    sVar3 = puVar12[1];
    if ((sVar3 != puVar13[1]) ||
       ((sVar3 != 0 && (iVar7 = bcmp((void *)*puVar12,(void *)*puVar13,sVar3), iVar7 != 0)))) {
      __assert_fail("header.name () == headers[i].name ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x334,"void (anonymous namespace)::readWholeFiles(int)");
    }
    uVar21 = CONCAT71((int7)(uVar23 >> 8),lVar26 == 0 && modification == 1);
    if (lVar26 == 0 && modification == 1) {
      puVar12 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
      puVar13 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
      sVar3 = puVar12[1];
      if ((sVar3 == puVar13[1]) &&
         ((sVar3 == 0 || (iVar7 = bcmp((void *)*puVar12,(void *)*puVar13,sVar3), iVar7 == 0)))) {
        __assert_fail("header.type () != headers[i].type ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                      ,0x337,"void (anonymous namespace)::readWholeFiles(int)");
      }
    }
    else {
      puVar12 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
      puVar13 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
      sVar3 = puVar12[1];
      if ((sVar3 != puVar13[1]) ||
         ((sVar3 != 0 && (iVar7 = bcmp((void *)*puVar12,(void *)*puVar13,sVar3), iVar7 != 0)))) {
        __assert_fail("header.type () == headers[i].type ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                      ,0x33b,"void (anonymous namespace)::readWholeFiles(int)");
      }
    }
    lVar26 = lVar26 + 1;
  }
  __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                ,0x32d,"void (anonymous namespace)::readWholeFiles(int)");
}

Assistant:

void
readWholeFiles (int modification)
{
    Array2D<unsigned int> uData;
    Array2D<float>        fData;
    Array2D<half>         hData;

    Array2D<unsigned int*> deepUData;
    Array2D<float*>        deepFData;
    Array2D<half*>         deepHData;

    Array2D<unsigned int> sampleCount;

    MultiPartInputFile file (filename.c_str ());
    for (int i = 0; i < file.parts (); i++)
    {
        const Header& header = file.header (i);
        assert (header.displayWindow () == headers[i].displayWindow ());
        assert (header.dataWindow () == headers[i].dataWindow ());
        assert (header.pixelAspectRatio () == headers[i].pixelAspectRatio ());
        assert (
            header.screenWindowCenter () == headers[i].screenWindowCenter ());
        assert (header.screenWindowWidth () == headers[i].screenWindowWidth ());
        assert (header.lineOrder () == headers[i].lineOrder ());
        assert (header.compression () == headers[i].compression ());
        assert (header.channels () == headers[i].channels ());
        assert (header.name () == headers[i].name ());
        if (modification == 1 && i == 0)
        {
            assert (header.type () != headers[i].type ());
        }
        else
        {
            assert (header.type () == headers[i].type ());
        }
    }

    cout << "Reading whole files " << flush;

    //
    // Shuffle part numbers.
    //
    vector<int> shuffledPartNumber;
    for (int i = modification > 0 ? 1 : 0;
         i < static_cast<int> (headers.size ());
         i++)
        shuffledPartNumber.push_back (i);
    for (size_t i = 0; i < shuffledPartNumber.size (); i++)
    {
        size_t a = random_int (shuffledPartNumber.size ());
        size_t b = random_int (shuffledPartNumber.size ());
        swap (shuffledPartNumber[a], shuffledPartNumber[b]);
    }

    //
    // Start reading whole files.
    //
    int partNumber;
    try
    {
        for (size_t i = 0; i < shuffledPartNumber.size (); i++)
        {
            partNumber = shuffledPartNumber[i];
            switch (partTypes[partNumber])
            {
                case 0: {
                    FrameBuffer frameBuffer;
                    setInputFrameBuffer (
                        frameBuffer,
                        pixelTypes[partNumber],
                        uData,
                        fData,
                        hData,
                        width,
                        height);

                    InputPart part (file, partNumber);
                    part.setFrameBuffer (frameBuffer);
                    part.readPixels (0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert (checkPixels<unsigned int> (
                                uData, width, height));
                            break;
                        case 1:
                            assert (checkPixels<float> (fData, width, height));
                            break;
                        case 2:
                            assert (checkPixels<half> (hData, width, height));
                            break;
                    }
                    break;
                }
                case 1: {
                    TiledInputPart part (file, partNumber);
                    int            numXLevels = part.numXLevels ();
                    int            numYLevels = part.numYLevels ();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel (xLevel, yLevel)) continue;

                            int w = part.levelWidth (xLevel);
                            int h = part.levelHeight (yLevel);

                            FrameBuffer frameBuffer;
                            setInputFrameBuffer (
                                frameBuffer,
                                pixelTypes[partNumber],
                                uData,
                                fData,
                                hData,
                                w,
                                h);

                            part.setFrameBuffer (frameBuffer);
                            int numXTiles = part.numXTiles (xLevel);
                            int numYTiles = part.numYTiles (yLevel);
                            part.readTiles (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert (checkPixels<unsigned int> (
                                        uData, w, h));
                                    break;
                                case 1:
                                    assert (checkPixels<float> (fData, w, h));
                                    break;
                                case 2:
                                    assert (checkPixels<half> (hData, w, h));
                                    break;
                            }
                        }
                    break;
                }
                case 2: {
                    DeepScanLineInputPart part (file, partNumber);

                    DeepFrameBuffer frameBuffer;

                    sampleCount.resizeErase (height, width);
                    frameBuffer.insertSampleCountSlice (Slice (
                        IMF::UINT,
                        (char*) (&sampleCount[0][0]),
                        sizeof (unsigned int) * 1,
                        sizeof (unsigned int) * width));

                    setInputDeepFrameBuffer (
                        frameBuffer,
                        pixelTypes[partNumber],
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    part.setFrameBuffer (frameBuffer);

                    part.readPixelSampleCounts (0, height - 1);

                    allocatePixels (
                        pixelTypes[partNumber],
                        sampleCount,
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    part.readPixels (0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert (checkPixels<unsigned int> (
                                sampleCount, deepUData, width, height));
                            break;
                        case 1:
                            assert (checkPixels<float> (
                                sampleCount, deepFData, width, height));
                            break;
                        case 2:
                            assert (checkPixels<half> (
                                sampleCount, deepHData, width, height));
                            break;
                    }

                    releasePixels (
                        pixelTypes[partNumber],
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    break;
                }
                case 3: {
                    DeepTiledInputPart part (file, partNumber);
                    int                numXLevels = part.numXLevels ();
                    int                numYLevels = part.numYLevels ();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel (xLevel, yLevel)) continue;

                            int w = part.levelWidth (xLevel);
                            int h = part.levelHeight (yLevel);

                            DeepFrameBuffer frameBuffer;

                            sampleCount.resizeErase (h, w);
                            frameBuffer.insertSampleCountSlice (Slice (
                                IMF::UINT,
                                (char*) (&sampleCount[0][0]),
                                sizeof (unsigned int) * 1,
                                sizeof (unsigned int) * w));

                            setInputDeepFrameBuffer (
                                frameBuffer,
                                pixelTypes[partNumber],
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);

                            part.setFrameBuffer (frameBuffer);

                            int numXTiles = part.numXTiles (xLevel);
                            int numYTiles = part.numYTiles (yLevel);

                            part.readPixelSampleCounts (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);

                            allocatePixels (
                                pixelTypes[partNumber],
                                sampleCount,
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);

                            part.readTiles (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert (checkPixels<unsigned int> (
                                        sampleCount, deepUData, w, h));
                                    break;
                                case 1:
                                    assert (checkPixels<float> (
                                        sampleCount, deepFData, w, h));
                                    break;
                                case 2:
                                    assert (checkPixels<half> (
                                        sampleCount, deepHData, w, h));
                                    break;
                            }

                            releasePixels (
                                pixelTypes[partNumber],
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);
                        }

                    break;
                }
            }
            cerr << "part " << partNumber << " ok ";
        }
    }
    catch (...)
    {
        cout << "Error while reading part " << partNumber << endl << flush;
        throw;
    }
}